

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::Country::Country(Country *this,int id,string *name,int continent)

{
  int *piVar1;
  string *this_00;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  
  piVar1 = (int *)operator_new(4);
  *piVar1 = id;
  this->cyID = piVar1;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)name);
  this->cyName = this_00;
  piVar1 = (int *)operator_new(4);
  *piVar1 = continent + -1;
  this->cyContinent = piVar1;
  pvVar2 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pAdjCountries = pvVar2;
  piVar1 = (int *)operator_new(4);
  *piVar1 = -1;
  this->pPlayerOwnerId = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->pNumberOfTroops = piVar1;
  return;
}

Assistant:

Map::Country::Country(int id, std::string name, int continent) {
    cyID = new int(id);
    cyName = new std::string(std::move(name));
    // each country only has one continent (-1 because we transform continent count to continent index)
    cyContinent = new int(continent - 1);
    pAdjCountries = new std::vector<Country*>;
    pPlayerOwnerId = new int(-1);
    pNumberOfTroops = new int(0);
}